

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O2

void save_shifts(void)

{
  Yshort *pYVar1;
  Yshort *pYVar2;
  shifts *psVar3;
  long lVar4;
  shifts **ppsVar5;
  
  psVar3 = (shifts *)allocate(nshifts * 4 + 0x14);
  psVar3->number = this_state->number;
  lVar4 = (long)nshifts;
  psVar3->nshifts = nshifts;
  pYVar2 = shiftset;
  pYVar1 = shiftset + lVar4;
  for (lVar4 = 0; (Yshort *)((long)pYVar2 + lVar4) < pYVar1; lVar4 = lVar4 + 4) {
    *(Yshort *)((long)psVar3->shift + lVar4) = *(Yshort *)((long)pYVar2 + lVar4);
  }
  ppsVar5 = &first_shift;
  if (last_shift != (shifts *)0x0) {
    ppsVar5 = &last_shift->next;
  }
  ((shifts *)ppsVar5)->next = psVar3;
  last_shift = psVar3;
  return;
}

Assistant:

void save_shifts()
{
    register shifts *p;
    register Yshort *sp1;
    register Yshort *sp2;
    register Yshort *send;

    p = (shifts *) allocate((unsigned) (sizeof(shifts) +
			(nshifts - 1) * sizeof(Yshort)));

    p->number = this_state->number;
    p->nshifts = nshifts;

    sp1 = shiftset;
    sp2 = p->shift;
    send = shiftset + nshifts;

    while (sp1 < send)
	*sp2++ = *sp1++;

    if (last_shift)
    {
	last_shift->next = p;
	last_shift = p;
    }
    else
    {
	first_shift = p;
	last_shift = p;
    }
}